

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

int __thiscall jrtplib::RTPExternalTransmitter::AbortWait(RTPExternalTransmitter *this)

{
  int iVar1;
  
  iVar1 = -0x97;
  if (((this->init == true) && (iVar1 = -0x96, this->created == true)) &&
     (iVar1 = -0x98, this->waitingfordata == true)) {
    RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
    this->m_abortCount = this->m_abortCount + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTWAITING;
	}

	m_abortDesc.SendAbortSignal();
	m_abortCount++;
	
	MAINMUTEX_UNLOCK
	return 0;
}